

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

int __thiscall gl4cts::VertexAttrib64BitTests::init(VertexAttrib64BitTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ApiErrorsTest *this_00;
  GetVertexAttribTest *this_01;
  LimitTest *this_02;
  VAOTest *this_03;
  
  this_00 = (ApiErrorsTest *)operator_new(0x1ab0);
  VertexAttrib64Bit::ApiErrorsTest::ApiErrorsTest(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (GetVertexAttribTest *)operator_new(0x1ad0);
  VertexAttrib64Bit::GetVertexAttribTest::GetVertexAttribTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (LimitTest *)operator_new(0x1ab8);
  VertexAttrib64Bit::LimitTest::LimitTest(this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (VAOTest *)operator_new(0x1bb0);
  VertexAttrib64Bit::VAOTest::VAOTest(this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  return extraout_EAX;
}

Assistant:

void VertexAttrib64BitTests::init(void)
{
	addChild(new VertexAttrib64Bit::ApiErrorsTest(m_context));
	addChild(new VertexAttrib64Bit::GetVertexAttribTest(m_context));
	addChild(new VertexAttrib64Bit::LimitTest(m_context));
	addChild(new VertexAttrib64Bit::VAOTest(m_context));
}